

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_writer.cpp
# Opt level: O2

void __thiscall diffusion::ShmWriter::ShmWriter(ShmWriter *this,string *shm_name,Size shm_size)

{
  shared_memory_object *this_00;
  char *pcVar1;
  mapped_region *pmVar2;
  __off_t __length;
  pointer __p;
  __uniq_ptr_impl<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
  local_38;
  
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR_write_00109c70;
  std::__cxx11::string::string((string *)&this->shm_name_,(string *)shm_name);
  this_00 = &this->shm_object_;
  boost::interprocess::shared_memory_object::shared_memory_object
            (this_00,(shm_name->_M_dataplus)._M_p,2);
  (this->shm_region_)._M_t.
  super___uniq_ptr_impl<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
  ._M_t.
  super__Tuple_impl<0UL,_boost::interprocess::mapped_region_*,_std::default_delete<boost::interprocess::mapped_region>_>
  .super__Head_base<0UL,_boost::interprocess::mapped_region_*,_false>._M_head_impl =
       (mapped_region *)0x0;
  this->writer_shm_body_offset_ = 0;
  boost::interprocess::shared_memory_object::truncate(this_00,(char *)(long)shm_size,__length);
  pmVar2 = (mapped_region *)operator_new(0x20);
  boost::interprocess::mapped_region::mapped_region<boost::interprocess::shared_memory_object>
            (pmVar2,this_00,read_write,0,0,(void *)0x0,-1);
  local_38._M_t.
  super__Tuple_impl<0UL,_boost::interprocess::mapped_region_*,_std::default_delete<boost::interprocess::mapped_region>_>
  .super__Head_base<0UL,_boost::interprocess::mapped_region_*,_false>._M_head_impl =
       (tuple<boost::interprocess::mapped_region_*,_std::default_delete<boost::interprocess::mapped_region>_>
        )(_Tuple_impl<0UL,_boost::interprocess::mapped_region_*,_std::default_delete<boost::interprocess::mapped_region>_>
          )0x0;
  std::
  __uniq_ptr_impl<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
  ::reset((__uniq_ptr_impl<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
           *)&this->shm_region_,pmVar2);
  std::
  unique_ptr<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
  ::~unique_ptr((unique_ptr<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
                 *)&local_38);
  pmVar2 = (this->shm_region_)._M_t.
           super___uniq_ptr_impl<boost::interprocess::mapped_region,_std::default_delete<boost::interprocess::mapped_region>_>
           ._M_t.
           super__Tuple_impl<0UL,_boost::interprocess::mapped_region_*,_std::default_delete<boost::interprocess::mapped_region>_>
           .super__Head_base<0UL,_boost::interprocess::mapped_region_*,_false>._M_head_impl;
  pcVar1 = (char *)pmVar2->m_base;
  this->shm_header_position_ = pcVar1;
  this->shm_body_position_ = pcVar1 + 8;
  this->shm_body_size_ = (int)pmVar2->m_size + -8;
  return;
}

Assistant:

ShmWriter::ShmWriter(std::string const & shm_name, Size shm_size)
    : shm_name_(shm_name),
      shm_object_(boost::interprocess::create_only, shm_name.c_str(), boost::interprocess::read_write),
      writer_shm_body_offset_(0) {
    shm_object_.truncate(shm_size);
    shm_region_ = std::unique_ptr<boost::interprocess::mapped_region>(new boost::interprocess::mapped_region(shm_object_, boost::interprocess::read_write));
    shm_header_position_ = reinterpret_cast<char *>(shm_region_->get_address());
    shm_body_position_ = shm_header_position_ + kShmHeaderLength;
    shm_body_size_ = shm_region_->get_size() - kShmHeaderLength;
}